

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O3

void bloaty::ReadDWARFDebugInfo
               (InfoReader *reader,Section section,DualMap *symbol_map,RangeSink *sink)

{
  uint16_t uVar1;
  pointer pAVar2;
  char *pcVar3;
  string_view sVar4;
  string_view sVar5;
  AttrValue val;
  AttrValue val_00;
  bool bVar6;
  Abbrev *pAVar7;
  long *plVar8;
  string_view *data;
  RangeSink *pRVar9;
  RangeSink *pRVar10;
  const_iterator __begin2;
  ulong *puVar11;
  pointer pAVar12;
  undefined1 **ppuVar13;
  size_t in_R8;
  char *pcVar14;
  const_iterator __end2;
  RangeSink *this;
  string_view sVar15;
  string_view sVar16;
  string_view name;
  string_view name_00;
  DwoFilePointer dwo_info;
  DIEReader die_reader;
  File dwo_dwarf;
  CU cu;
  CUIter iter;
  GeneralDIE compileunit_die;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_370;
  ulong local_360 [2];
  File *local_350;
  InputFileFactory local_348;
  RangeSink *local_340;
  undefined1 *local_338;
  long local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308;
  undefined7 uStack_307;
  undefined1 local_2f8 [32];
  InfoReader *local_2d8;
  undefined1 local_2d0 [8];
  undefined1 local_2c8 [40];
  bool local_2a0;
  bool local_290;
  _Storage<unsigned_long,_true> local_288;
  bool local_280;
  bool local_270;
  bool local_260;
  bool local_250;
  bool local_240;
  bool local_230;
  bool local_220;
  bool local_218;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  undefined1 local_1b8 [128];
  uint64_t local_138;
  uint64_t uStack_130;
  uint64_t local_128;
  _Any_data _Stack_120;
  _Manager_type p_Stack_110;
  _Invoker_type local_108;
  CUIter local_100;
  GeneralDIE local_e8;
  
  local_350 = (File *)symbol_map;
  local_2d8 = reader;
  dwarf::InfoReader::GetCUIter(&local_100,reader,section,0);
  local_1b8._96_8_ = local_1b8 + 0x70;
  local_1b8._24_8_ = (InputFile *)0x0;
  local_1b8._32_8_ = (_func_int **)0x0;
  local_1b8._8_8_ = 0;
  local_1b8._16_8_ = (char *)0x0;
  local_1b8._104_8_ = 0;
  local_1b8[0x70] = '\0';
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  _Stack_120._M_unused._M_object = (void *)0x0;
  _Stack_120._8_8_ = 0;
  p_Stack_110 = (_Manager_type)0x0;
  local_108 = (_Invoker_type)0x0;
  local_1d8._8_8_ = local_1b8;
  local_1c0 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
              ::_M_manager;
  local_1d8._M_unused._M_object = sink;
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator=
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&_Stack_120,
             (function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  local_2f8._24_8_ = &PTR__InputFileFactory_0061b120;
  local_340 = sink;
  do {
    bVar6 = dwarf::CUIter::NextCU(&local_100,local_2d8,(CU *)local_1b8);
    if (!bVar6) {
      if (p_Stack_110 != (_Manager_type)0x0) {
        (*p_Stack_110)(&_Stack_120,&_Stack_120,__destroy_functor);
      }
      if ((RangeSink *)local_1b8._96_8_ != (RangeSink *)(local_1b8 + 0x70)) {
        operator_delete((void *)local_1b8._96_8_,CONCAT71(local_1b8._113_7_,local_1b8[0x70]) + 1);
      }
      return;
    }
    local_2f8._0_8_ = local_1b8._24_8_;
    local_2f8._8_8_ = local_1b8._32_8_;
    local_2f8._16_4_ = 0;
    pcVar14 = (char *)0x0;
    local_e8.name.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_string.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_uint64.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.low_pc.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_addr.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_size.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.rnglistx.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.ranges.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.start_scope.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.declaration = false;
    local_330 = 0;
    local_328 = 0;
    local_318 = &local_308;
    local_310 = 0;
    local_308 = 0;
    local_338 = &local_328;
    pAVar7 = dwarf::DIEReader::ReadCode((DIEReader *)local_2f8,(CU *)local_1b8);
    sVar15._M_str = pcVar14;
    sVar15._M_len = in_R8;
    pAVar2 = (pAVar7->attr).
             super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this = local_340;
    for (pAVar12 = (pAVar7->attr).
                   super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_340 = this, pAVar12 != pAVar2;
        pAVar12 = pAVar12 + 1) {
      uVar1 = pAVar12->name;
      data = (string_view *)local_2f8;
      dwarf::AttrValue::ParseAttr
                ((AttrValue *)&local_370.string_,(CU *)local_1b8,pAVar12->form,data);
      local_2c8._16_8_ = local_360[0];
      local_2c8._0_8_ = local_370.uint_;
      local_2c8._8_8_ = local_370.string_._M_str;
      val.field_0.string_._M_str = local_370.string_._M_str;
      val.field_0.uint_ = local_370.uint_;
      val.form_ = (undefined2)local_360[0];
      val._18_2_ = local_360[0]._2_2_;
      val.type_ = local_360[0]._4_4_;
      ReadGeneralDIEAttr(uVar1,val,(CU *)local_1b8,&local_e8);
      sVar15._M_str = (char *)data;
      sVar15._M_len = in_R8;
      sVar5._M_str = (char *)data;
      sVar5._M_len = in_R8;
      sVar4._M_str = (char *)data;
      sVar4._M_len = in_R8;
      if (uVar1 == 0x2130) {
        if ((local_2c8._20_4_ & ~kUnresolvedUint) == kString) {
          sVar15 = dwarf::AttrValue::GetString((AttrValue *)local_2c8,(CU *)local_1b8);
          plVar8 = &local_310;
          ppuVar13 = &local_318;
          goto LAB_001b4e5a;
        }
      }
      else {
        sVar15 = sVar4;
        if ((uVar1 == 0x1b) && (sVar15 = sVar5, (local_2c8._20_4_ & ~kUnresolvedUint) == kString)) {
          sVar15 = dwarf::AttrValue::GetString((AttrValue *)local_2c8,(CU *)local_1b8);
          plVar8 = &local_330;
          ppuVar13 = &local_338;
LAB_001b4e5a:
          std::__cxx11::string::_M_replace((ulong)ppuVar13,0,(char *)*plVar8,(ulong)sVar15._M_str);
        }
      }
      in_R8 = sVar15._M_len;
      this = local_340;
    }
    pRVar10 = (RangeSink *)sVar15._M_len;
    if ((local_330 != 0) && (local_310 != 0)) {
      local_370.uint_ = (uint64_t)local_360;
      local_2d0 = (undefined1  [8])local_2f8._24_8_;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_338,local_338 + local_330);
      std::__cxx11::string::append((char *)&local_370.uint_);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_370.uint_,(ulong)local_318);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar11) {
        local_2c8._16_8_ = *puVar11;
        local_2c8._24_8_ = plVar8[3];
        local_2c8._0_8_ = local_2c8 + 0x10;
      }
      else {
        local_2c8._16_8_ = *puVar11;
        local_2c8._0_8_ = (ulong *)*plVar8;
      }
      local_2c8._8_8_ = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      MmapInputFileFactory::OpenFile((MmapInputFileFactory *)&local_348,(string *)local_2d0);
      if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
        operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
      }
      if ((ulong *)local_370.uint_ != local_360) {
        operator_delete((void *)local_370.uint_,local_360[0] + 1);
      }
      memset((File *)local_2c8,0,0xe0);
      (**(OpenDwarf **)(local_1b8._0_8_ + 0xe8))
                ((InputFile *)local_348._vptr_InputFileFactory,(File *)local_2c8,this);
      pRVar9 = this;
      ReadDWARFCompileUnits((bloaty *)local_2c8,local_350,(DualMap *)local_1b8,(CU *)this,pRVar10);
      sVar15._M_str = (char *)pRVar9;
      sVar15._M_len = (size_t)pRVar10;
      if ((InputFile *)local_348._vptr_InputFileFactory != (InputFile *)0x0) {
        (**(code **)(*local_348._vptr_InputFileFactory + 0x10))();
        sVar15._M_str = (char *)pRVar9;
        sVar15._M_len = (size_t)pRVar10;
      }
    }
    if (local_1b8._104_8_ != 0) {
      pcVar14 = (this->file_->data_)._M_str;
      if ((pcVar14 <= (ulong)local_1b8._16_8_) &&
         ((ulong)local_1b8._16_8_ < pcVar14 + (this->file_->data_)._M_len)) {
        sVar16._M_str = (char *)local_1b8._96_8_;
        sVar16._M_len = local_1b8._104_8_;
        RangeSink::AddFileRange
                  (this,"dwarf_debuginfo",sVar16,local_1b8._16_8_ - (long)pcVar14,local_1b8._8_8_);
      }
      AddDIE((CU *)local_1b8,&local_e8,(DualMap *)local_350,this);
      if (local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_2c8._0_8_ = ((string_view *)(local_1b8._0_8_ + 0x40))->_M_len;
        local_2c8._8_8_ = ((string_view *)(local_1b8._0_8_ + 0x40))->_M_str;
        puVar11 = (ulong *)(local_2c8._0_8_ -
                           (long)local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>.
                                 _M_payload.super__Optional_payload_base<unsigned_long>._M_payload);
        if ((ulong)local_2c8._0_8_ <
            local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
          Throw("premature EOF reading variable-length DWARF data",0xad);
        }
        pcVar14 = (char *)(local_2c8._8_8_ +
                          local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>.
                          _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value
                          );
        local_2c8._0_8_ = puVar11;
        local_2c8._8_8_ = pcVar14;
        sVar16 = dwarf::CompilationUnitSizes::ReadInitialLength
                           ((CompilationUnitSizes *)&local_370.string_,(string_view *)local_2c8);
        local_2c8._0_8_ = sVar16._M_str + (sVar16._M_len - (long)pcVar14);
        if (puVar11 < sVar16._M_str + (sVar16._M_len - (long)pcVar14)) {
          local_2c8._0_8_ = puVar11;
        }
        pcVar3 = (this->file_->data_)._M_str;
        local_2c8._8_8_ = pcVar14;
        if ((pcVar3 <= pcVar14) && (pcVar14 < pcVar3 + (this->file_->data_)._M_len)) {
          name._M_str = (char *)local_1b8._96_8_;
          name._M_len = local_1b8._104_8_;
          RangeSink::AddFileRange
                    (this,"dwarf_stmtlistrange",name,(long)pcVar14 - (long)pcVar3,local_2c8._0_8_);
        }
      }
      pcVar14 = *(char **)&(((Options *)(local_1b8._48_8_ + 8))->base_filename_).
                           super_RepeatedPtrFieldBase.current_size_;
      pcVar3 = (this->file_->data_)._M_str;
      pRVar10 = (RangeSink *)local_1b8._48_8_;
      if ((pcVar3 <= pcVar14) && (pcVar14 < pcVar3 + (this->file_->data_)._M_len)) {
        pcVar14 = pcVar14 + -(long)pcVar3;
        name_00._M_str = (char *)local_1b8._96_8_;
        name_00._M_len = local_1b8._104_8_;
        pRVar10 = (RangeSink *)local_1b8._96_8_;
        RangeSink::AddFileRange
                  (this,"dwarf_abbrev",name_00,(uint64_t)pcVar14,
                   (uint64_t)
                   (((Options *)(local_1b8._48_8_ + 8))->base_filename_).super_RepeatedPtrFieldBase.
                   arena_);
      }
      while( true ) {
        pAVar7 = dwarf::DIEReader::ReadCode((DIEReader *)local_2f8,(CU *)local_1b8);
        sVar15._M_str = (char *)pRVar10;
        sVar15._M_len = (size_t)pcVar14;
        if (pAVar7 == (Abbrev *)0x0) break;
        local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
        local_2a0 = false;
        local_290 = false;
        local_280 = false;
        local_270 = false;
        local_260 = false;
        local_250 = false;
        local_240 = false;
        local_230 = false;
        local_220 = false;
        local_218 = false;
        pAVar12 = (pAVar7->attr).
                  super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar2 = (pAVar7->attr).
                 super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pAVar12 == pAVar2) {
LAB_001b5225:
          if (local_218 == true) goto LAB_001b522f;
          pRVar10 = this;
          AddDIE((CU *)local_1b8,(GeneralDIE *)local_2c8,(DualMap *)local_350,this);
        }
        else {
          do {
            uVar1 = pAVar12->name;
            pRVar10 = (RangeSink *)local_2f8;
            dwarf::AttrValue::ParseAttr
                      ((AttrValue *)&local_370.string_,(CU *)local_1b8,pAVar12->form,
                       (string_view *)pRVar10);
            val_00.field_0.string_._M_str = local_370.string_._M_str;
            val_00.field_0.uint_ = local_370.uint_;
            val_00.form_ = (undefined2)local_360[0];
            val_00._18_2_ = local_360[0]._2_2_;
            val_00.type_ = local_360[0]._4_4_;
            ReadGeneralDIEAttr(uVar1,val_00,(CU *)local_1b8,(GeneralDIE *)local_2c8);
            this = local_340;
            pAVar12 = pAVar12 + 1;
          } while (pAVar12 != pAVar2);
          if (((local_280 & 1U) == 0) ||
             (bVar6 = dwarf::IsValidDwarfAddress
                                (local_288._M_value,local_1b8[0x2b] * '\x04' + '\x04'), bVar6))
          goto LAB_001b5225;
LAB_001b522f:
          dwarf::DIEReader::SkipChildren((DIEReader *)local_2f8,(CU *)local_1b8,pAVar7);
        }
      }
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
    }
    in_R8 = sVar15._M_len;
    if (local_338 != &local_328) {
      operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
      in_R8 = sVar15._M_len;
    }
  } while( true );
}

Assistant:

static void ReadDWARFDebugInfo(dwarf::InfoReader& reader,
                               dwarf::InfoReader::Section section,
                               const DualMap& symbol_map, RangeSink* sink) {
  dwarf::CUIter iter = reader.GetCUIter(section);
  dwarf::CU cu;
  cu.SetIndirectStringCallback([sink, &cu](string_view str) {
    sink->AddFileRange("dwarf_strp", cu.unit_name(), str);
  });

  while (iter.NextCU(reader, &cu)) {
    dwarf::DIEReader die_reader = cu.GetDIEReader();
    GeneralDIE compileunit_die;
    DwoFilePointer dwo_info;
    auto* abbrev = die_reader.ReadCode(cu);
    die_reader.ReadAttributes(
        cu, abbrev,
        [&](uint16_t tag, dwarf::AttrValue value) {
          ReadGeneralDIEAttr(tag, value, cu, &compileunit_die);
          switch (tag) {
            case DW_AT_comp_dir:
              if (value.IsString()) {
                dwo_info.comp_dir = value.GetString(cu);
              }
              break;
            case DW_AT_GNU_dwo_name:
              if (value.IsString()) {
                dwo_info.dwo_name = value.GetString(cu);
              }
              break;
          }
        });

    if (!dwo_info.comp_dir.empty() && !dwo_info.dwo_name.empty()) {
      auto file = MmapInputFileFactory().OpenFile(dwo_info.comp_dir + "/" + dwo_info.dwo_name);
      dwarf::File dwo_dwarf;
      cu.dwarf().open(*file, &dwo_dwarf, sink);
      ReadDWARFCompileUnits(dwo_dwarf, symbol_map, &cu, sink);
    }

    if (cu.unit_name().empty()) {
      continue;
    }

    sink->AddFileRange("dwarf_debuginfo", cu.unit_name(), cu.entire_unit());
    AddDIE(cu, compileunit_die, symbol_map, sink);

    if (compileunit_die.stmt_list) {
      ReadDWARFStmtListRange(cu, *compileunit_die.stmt_list, sink);
    }

    sink->AddFileRange("dwarf_abbrev", cu.unit_name(), cu.unit_abbrev().abbrev_data());

    while (auto abbrev = die_reader.ReadCode(cu)) {
      GeneralDIE die;
      die_reader.ReadAttributes(
          cu, abbrev, [&cu, &die](uint16_t tag, dwarf::AttrValue value) {
            ReadGeneralDIEAttr(tag, value, cu, &die);
          });

      // low_pc == 0 is a signal that this routine was stripped out of the
      // final binary. Also any declaration should be skipped.
      if ((die.low_pc && !cu.IsValidDwarfAddress(*die.low_pc)) ||
          die.declaration) {
        die_reader.SkipChildren(cu, abbrev);
      } else {
        AddDIE(cu, die, symbol_map, sink);
      }
    }
  }
}